

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool __thiscall google::protobuf::Descriptor::IsExtensionNumber(Descriptor *this,int number)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  
  uVar1 = (ulong)*(int *)(this + 0x58);
  bVar3 = 0 < (long)uVar1;
  if (0 < (long)uVar1) {
    uVar2 = 1;
    do {
      if ((*(int *)(*(long *)(this + 0x60) + -8 + uVar2 * 8) <= number) &&
         (number < *(int *)(*(long *)(this + 0x60) + -4 + uVar2 * 8))) {
        return bVar3;
      }
      bVar3 = uVar2 < uVar1;
      bVar4 = uVar2 != uVar1;
      uVar2 = uVar2 + 1;
    } while (bVar4);
  }
  return bVar3;
}

Assistant:

bool Descriptor::IsExtensionNumber(int number) const {
  // Linear search should be fine because we don't expect a message to have
  // more than a couple extension ranges.
  for (int i = 0; i < extension_range_count(); i++) {
    if (number >= extension_range(i)->start &&
        number <  extension_range(i)->end) {
      return true;
    }
  }
  return false;
}